

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O0

void __thiscall
QListViewPrivate::removeCurrentAndDisabled
          (QListViewPrivate *this,QList<QModelIndex> *indexes,QModelIndex *current)

{
  long lVar1;
  anon_class_32_2_1156e026_for__M_pred pred;
  undefined1 (*in_RDX) [24];
  long in_FS_OFFSET;
  anon_class_32_2_1156e026_for__M_pred isCurrentOrDisabled;
  totally_ordered_wrapper<const_QAbstractItemModel_*> in_stack_ffffffffffffff98;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pred.current.m.ptr = in_stack_ffffffffffffff98.ptr;
  pred._0_24_ = *in_RDX;
  QList<QModelIndex>::
  removeIf<QListViewPrivate::removeCurrentAndDisabled(QList<QModelIndex>*,QModelIndex_const&)const::__0>
            ((QList<QModelIndex> *)0x87c955,pred);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QListViewPrivate::removeCurrentAndDisabled(QList<QModelIndex> *indexes,
                                                const QModelIndex &current) const
{
    auto isCurrentOrDisabled = [this, current](const QModelIndex &index) {
        return !isIndexEnabled(index) || index == current;
    };
    indexes->removeIf(isCurrentOrDisabled);
}